

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O2

Mvc_Cover_t * Mvc_CoverRemap(Mvc_Cover_t *p,int *pVarsRem,int nVarsRem)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Mvc_Cover_t *pCover;
  Mvc_Cube_t *pMVar5;
  byte bVar6;
  Mvc_Cube_t *pMVar7;
  Mvc_Cube_t *pMVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  Mvc_List_t *pList;
  
  pCover = Mvc_CoverAlloc(p->pMem,nVarsRem);
  pMVar8 = (Mvc_Cube_t *)&p->lCubes;
  while (pMVar8 = pMVar8->pNext, pMVar8 != (Mvc_Cube_t *)0x0) {
    pMVar5 = Mvc_CubeAlloc(pCover);
    uVar2 = *(uint *)&pMVar5->field_0x8;
    uVar11 = uVar2 & 0xffffff;
    bVar6 = (byte)(uVar2 >> 0x18);
    if ((ulong)uVar11 == 1) {
      pMVar5->pData[0] = 0xffffffff;
      *(uint *)&pMVar5->field_0x14 = 0xffffffff >> (bVar6 & 0x1f);
    }
    else if (uVar11 == 0) {
      pMVar5->pData[0] = 0xffffffff >> (bVar6 & 0x1f);
    }
    else {
      pMVar5->pData[uVar11] = 0xffffffff >> (bVar6 & 0x1f);
      for (uVar9 = (ulong)(uVar2 & 0xffffff); 0 < (long)uVar9; uVar9 = uVar9 - 1) {
        pMVar5->pData[uVar9 - 1] = 0xffffffff;
      }
    }
    pMVar7 = (Mvc_Cube_t *)&pCover->lCubes;
    if ((pCover->lCubes).pHead != (Mvc_Cube_t *)0x0) {
      pMVar7 = (pCover->lCubes).pTail;
    }
    pMVar7->pNext = pMVar5;
    (pCover->lCubes).pTail = pMVar5;
    pMVar5->pNext = (Mvc_Cube_t *)0x0;
    piVar1 = &(pCover->lCubes).nItems;
    *piVar1 = *piVar1 + 1;
  }
  uVar10 = 0;
  uVar9 = (ulong)(uint)nVarsRem;
  if (nVarsRem < 1) {
    uVar9 = uVar10;
  }
  do {
    if (uVar10 == uVar9) {
      return pCover;
    }
    uVar2 = pVarsRem[uVar10];
    if (-1 < (int)uVar2) {
      if (p->nBits <= (int)uVar2) {
        __assert_fail("pVarsRem[i] >= 0 && pVarsRem[i] < p->nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/mvc/mvcUtils.c"
                      ,0x1a4,"Mvc_Cover_t *Mvc_CoverRemap(Mvc_Cover_t *, int *, int)");
      }
      iVar3 = Mvc_CoverReadCubeNum(p);
      iVar4 = Mvc_CoverReadCubeNum(pCover);
      if (iVar3 != iVar4) {
        __assert_fail("Mvc_CoverReadCubeNum(pCoverOld) == Mvc_CoverReadCubeNum(pCoverNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/mvc/mvcUtils.c"
                      ,0x1be,"void Mvc_CoverCopyColumn(Mvc_Cover_t *, Mvc_Cover_t *, int, int)");
      }
      uVar12 = uVar10 >> 5 & 0x7ffffff;
      pMVar5 = Mvc_CoverReadCubeHead(pCover);
      bVar6 = (byte)uVar10 & 0x1f;
      pMVar8 = (Mvc_Cube_t *)&p->lCubes;
      while (pMVar8 = pMVar8->pNext, pMVar8 != (Mvc_Cube_t *)0x0) {
        uVar11 = pMVar5->pData[uVar12] | 1 << ((byte)uVar10 & 0x1f);
        if ((pMVar8->pData[uVar2 >> 5] & 1 << ((byte)uVar2 & 0x1f)) == 0) {
          uVar11 = pMVar5->pData[uVar12] & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
        }
        pMVar5->pData[uVar12] = uVar11;
        pMVar5 = pMVar5->pNext;
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

Mvc_Cover_t * Mvc_CoverRemap( Mvc_Cover_t * p, int * pVarsRem, int nVarsRem )
{
    Mvc_Cover_t * pCover;
    Mvc_Cube_t * pCube, * pCubeCopy;
    int i;
    // clone the cover
    pCover = Mvc_CoverAlloc( p->pMem, nVarsRem );
    // copy the cube list
    Mvc_CoverForEachCube( p, pCube )
    {
        pCubeCopy = Mvc_CubeAlloc( pCover );
        //Mvc_CubeBitClean( pCubeCopy );   //changed by wjiang
        Mvc_CubeBitFill( pCubeCopy );      //changed by wjiang
        Mvc_CoverAddCubeTail( pCover, pCubeCopy );
    }
    // copy the corresponding columns
    for ( i = 0; i < nVarsRem; i++ )
    {
        if (pVarsRem[i] < 0) 
            continue;     //added by wjiang
        assert( pVarsRem[i] >= 0 && pVarsRem[i] < p->nBits );
        Mvc_CoverCopyColumn( p, pCover, pVarsRem[i], i );
    }
    return pCover;
}